

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::format_double_abi_cxx11_(CompilerGLSL *this,double value)

{
  long in_RSI;
  double value_local;
  CompilerGLSL *this_local;
  
  if (*(long *)(in_RSI + 0x2658) == 0) {
    convert_to_string_abi_cxx11_((spirv_cross *)this,value,*(char *)(in_RSI + 0x25e0));
  }
  else {
    (**(code **)(**(long **)(in_RSI + 0x2658) + 0x18))(value,this);
  }
  return this;
}

Assistant:

std::string CompilerGLSL::format_double(double value) const
{
	if (float_formatter)
		return float_formatter->format_double(value);

	// default behavior
	return convert_to_string(value, current_locale_radix_character);
}